

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

MTBDD mtbdd_enum_all_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  ulong uVar2;
  int iVar3;
  llmsset_t plVar4;
  MTBDD MVar5;
  long lVar6;
  uint8_t *arr_00;
  long lVar7;
  ulong uVar8;
  
  if (dd == 0) {
    return 0;
  }
  arr_00 = arr + 1;
  plVar4 = nodes;
  do {
    puVar1 = plVar4->data;
    lVar6 = (variables & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar6);
    uVar8 = dd;
    if ((dd & 0x7fffffffffffffff) == 0) {
LAB_00115aa1:
      if ((filter_cb != (mtbdd_enum_filter_cb)0x0) &&
         (iVar3 = (*filter_cb)(dd), plVar4 = nodes, iVar3 == 0)) {
        return 0;
      }
    }
    else {
      lVar7 = (dd & 0xffffffffff) * 0x10;
      if ((*(ulong *)(puVar1 + lVar7) >> 0x3e & 1) != 0) goto LAB_00115aa1;
      if ((*(ulong *)(puVar1 + lVar6 + 8) ^ *(ulong *)(puVar1 + lVar7 + 8)) < 0x10000000000) {
        uVar8 = dd & 0x8000000000000000;
        dd = *(ulong *)(puVar1 + lVar7 + 8) & 0xffffffffff | uVar8;
        uVar8 = uVar8 ^ *(ulong *)(puVar1 + lVar7) & 0x800000ffffffffff;
      }
    }
    variables = variables & 0x8000000000000000 ^ uVar2 & 0x800000ffffffffff;
    if (arr_00[-1] != '\x01') {
      if (arr_00[-1] != '\0') {
        __assert_fail("*arr == 0 || *arr == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                      ,0xaa1,
                      "MTBDD mtbdd_enum_all_next(MTBDD, MTBDD, uint8_t *, mtbdd_enum_filter_cb)");
      }
      MVar5 = mtbdd_enum_all_next(dd,variables,arr_00,filter_cb);
      if (MVar5 == 0) {
        MVar5 = mtbdd_enum_all_first(uVar8,variables,arr_00,filter_cb);
        if (MVar5 == 0) {
          return 0;
        }
        arr_00[-1] = '\x01';
        return MVar5;
      }
      return MVar5;
    }
    if (uVar8 == 0) {
      return 0;
    }
    arr_00 = arr_00 + 1;
    dd = uVar8;
    if (variables == 0x8000000000000000) {
      return 0;
    }
  } while( true );
}

Assistant:

MTBDD
mtbdd_enum_all_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf False is skipped
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // if this assertion fails, then <variables> is not the support of <dd>.
        // actually, remove this check to allow for "partial" enumeration
        // assert(mtbdd_isleaf(dd));
        // no next if there are no variables
        return mtbdd_false;
    } else {
        // get next variable from <variables>
        mtbddnode_t nv = MTBDD_GETNODE(variables);
        variables = node_gethigh(variables, nv);

        // filter leaf (if leaf) or get cofactors (if not leaf)
        mtbddnode_t ndd = MTBDD_GETNODE(dd);
        MTBDD low, high;
        if (mtbdd_isleaf(dd)) {
            // a leaf for which the filter returns 0 is skipped
            if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
            low = high = dd;
        } else {
            // get cofactors
            if (mtbddnode_getvariable(ndd) == mtbddnode_getvariable(nv)) {
                low = node_getlow(dd, ndd);
                high = node_gethigh(dd, ndd);
            } else {
                low = high = dd;
            }
        }

        // try recursive next first
        if (*arr == 0) {
            MTBDD res = mtbdd_enum_all_next(low, variables, arr+1, filter_cb);
            if (res != mtbdd_false) return res;
        } else if (*arr == 1) {
            return mtbdd_enum_all_next(high, variables, arr+1, filter_cb);
            // if *arr was 1 and _next returns False, return False
        } else {
            // the array is invalid...
            assert(*arr == 0 || *arr == 1);
            return mtbdd_invalid;  // in Release mode, the assertion is empty code
        }

        // previous was low, try following high
        MTBDD res = mtbdd_enum_all_first(high, variables, arr+1, filter_cb);
        if (res == mtbdd_false) return mtbdd_false;

        // succesful, set arr
        *arr = 1;
        return res;
    }
}